

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>,_testing::internal::CastAndAppendTransform<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>_>
::
IterateOverTuple<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>,_2UL>
::operator()(IterateOverTuple<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>,_2UL>
             *this,tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
                   *param_2,
            IterateOverTuple<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>,_2UL>
            *param_3)

{
  __tuple_element_t<0UL,_tuple<PairMatcher<const_char_*,_const_char_*>,_PairMatcher<const_char_*,_const_char_*>_>_>
  *a;
  back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
  *this_00;
  back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
  bVar1;
  IterateOverTuple<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>,_1UL>
  local_5d [13];
  back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
  local_50;
  Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  local_48;
  tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  *local_30;
  tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  *t_local;
  IterateOverTuple<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>,_2UL>
  *this_local;
  back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
  out_local;
  
  local_30 = param_2;
  t_local = (tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
             *)this;
  this_local = param_3;
  a = std::
      get<0ul,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
                (param_2);
  CastAndAppendTransform<std::pair<std::__cxx11::string,std::__cxx11::string>const&>::operator()
            (&local_48,
             (CastAndAppendTransform<std::pair<std::__cxx11::string,std::__cxx11::string>const&> *)
             ((long)&out_local.container + 7),a);
  local_50 = std::
             back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
             ::operator++((back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
                           *)&this_local,0);
  this_00 = std::
            back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
            ::operator*(&local_50);
  std::
  back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
  ::operator=(this_00,&local_48);
  Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~Matcher(&local_48);
  bVar1 = IterateOverTuple<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>,_1UL>
          ::operator()(local_5d,local_30,this_local);
  return (back_insert_iterator<std::vector<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }